

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::PortConcatenationSyntax::PortConcatenationSyntax
          (PortConcatenationSyntax *this,Token openBrace,
          SeparatedSyntaxList<slang::syntax::PortReferenceSyntax> *references,Token closeBrace)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  PortReferenceSyntax *pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  size_t index;
  
  uVar6 = closeBrace._0_8_;
  uVar5 = openBrace._0_8_;
  (this->super_PortExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PortExpressionSyntax).super_SyntaxNode.kind = PortConcatenation;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  SVar2 = (references->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(references->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->references).super_SyntaxListBase.super_SyntaxNode.parent =
       (references->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->references).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->references).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->references).super_SyntaxListBase.childCount = (references->super_SyntaxListBase).childCount
  ;
  (this->references).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0050b940;
  sVar1 = (references->elements).size_;
  (this->references).elements.data_ = (references->elements).data_;
  (this->references).elements.size_ = sVar1;
  (this->closeBrace).kind = (short)uVar6;
  (this->closeBrace).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->closeBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->closeBrace).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->closeBrace).info = closeBrace.info;
  (this->references).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar7 = (this->references).elements.size_ + 1;
  if (1 < uVar7) {
    index = 0;
    do {
      pPVar4 = SeparatedSyntaxList<slang::syntax::PortReferenceSyntax>::operator[]
                         (&this->references,index);
      (pPVar4->super_PortExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
      index = index + 1;
    } while (uVar7 >> 1 != index);
  }
  return;
}

Assistant:

struct SLANG_EXPORT NamedLabelSyntax : public SyntaxNode {
    Token name;
    Token colon;

    NamedLabelSyntax(Token name, Token colon) :
        SyntaxNode(SyntaxKind::NamedLabel), name(name), colon(colon) {
    }

    explicit NamedLabelSyntax(const NamedLabelSyntax&) = default;

    static bool isKind(SyntaxKind kind);

    TokenOrSyntax getChild(size_t index);
    ConstTokenOrSyntax getChild(size_t index) const;
    void setChild(size_t index, TokenOrSyntax child);

}